

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Error af_latin_hints_apply
                   (FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline,
                   AF_LatinMetrics metrics)

{
  AF_AxisHintsRec *pAVar1;
  AF_Edge pAVar2;
  AF_Segment_conflict pAVar3;
  AF_Segment pAVar4;
  AF_Edge_conflict pAVar5;
  FT_Error FVar6;
  AF_Edge_conflict pAVar7;
  FT_Pos FVar8;
  FT_Long FVar9;
  AF_Segment_conflict pAVar10;
  int iVar11;
  int iVar12;
  AF_Edge_conflict pAVar13;
  ulong uVar14;
  AF_Edge_conflict pAVar15;
  AF_Segment_conflict pAVar16;
  long lVar17;
  AF_Width pAVar18;
  AF_Edge_conflict pAVar19;
  ulong uVar20;
  AF_Edge_conflict pAVar21;
  byte bVar22;
  byte bVar23;
  AF_Dimension dim;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  AF_Segment_conflict pAVar31;
  long lVar32;
  uint uVar33;
  AF_Edge_conflict pAVar34;
  ulong uVar35;
  AF_Width pAVar36;
  ulong uVar37;
  AF_Edge_conflict pAVar38;
  int iVar39;
  int iVar40;
  AF_Edge_conflict pAVar41;
  bool bVar42;
  bool bVar43;
  
  FVar6 = af_glyph_hints_reload(hints,outline);
  if ((FVar6 == 0) &&
     (((hints->scaler_flags & 1) != 0 ||
      (FVar6 = af_latin_hints_detect_features
                         (hints,metrics->axis[0].width_count,metrics->axis[0].widths,
                          AF_DIMENSION_HORZ), FVar6 == 0)))) {
    if ((hints->scaler_flags & 2) == 0) {
      FVar6 = af_latin_hints_detect_features
                        (hints,metrics->axis[1].width_count,metrics->axis[1].widths,
                         AF_DIMENSION_VERT);
      if (FVar6 != 0) {
        return FVar6;
      }
      if ((*(byte *)((long)((metrics->root).globals)->glyph_styles + (ulong)glyph_index * 2 + 1) &
          0x40) == 0) {
        pAVar7 = hints->axis[1].edges;
        if (pAVar7 == (AF_Edge_conflict)0x0) {
          pAVar34 = (AF_Edge_conflict)0x0;
        }
        else {
          pAVar34 = pAVar7 + hints->axis[1].num_edges;
        }
        if (pAVar7 < pAVar34) {
          lVar17 = (long)(int)metrics->axis[1].scale;
          lVar24 = ((ulong)metrics->units_per_em / 0x28) * lVar17;
          iVar11 = (int)((ulong)((lVar24 >> 0x3f) + lVar24 + 0x8000) >> 0x10);
          iVar39 = 0x20;
          if (iVar11 < 0x20) {
            iVar39 = iVar11;
          }
          uVar28 = (ulong)metrics->axis[1].blue_count;
          do {
            if (uVar28 == 0) {
              bVar42 = true;
              pAVar18 = (AF_Width)0x0;
            }
            else {
              pAVar18 = (AF_Width)0x0;
              bVar22 = 0;
              pAVar36 = &metrics->axis[1].blues[0].ref;
              uVar37 = uVar28;
              iVar11 = iVar39;
              do {
                uVar33 = *(uint *)&pAVar36[2].fit;
                if ((uVar33 & 1) != 0) {
                  bVar23 = (byte)uVar33 >> 3 & 1;
                  if ((bVar23 != 0) ||
                     (((uVar33 & 6) != 0) != (hints->axis[1].major_dir == (int)pAVar7->dir))) {
                    lVar32 = (long)pAVar7->fpos;
                    lVar24 = ((AF_WidthRec *)&pAVar36->org)->org;
                    lVar27 = lVar32 - lVar24;
                    lVar26 = -lVar27;
                    if (0 < lVar27) {
                      lVar26 = lVar27;
                    }
                    lVar26 = (int)lVar26 * lVar17;
                    uVar20 = lVar26 + (lVar26 >> 0x3f) + 0x8000;
                    iVar12 = (int)(uVar20 >> 0x10);
                    iVar40 = iVar12;
                    if (iVar11 < iVar12) {
                      iVar40 = iVar11;
                    }
                    if (iVar12 < iVar11) {
                      pAVar18 = pAVar36;
                      bVar22 = bVar23;
                    }
                    iVar11 = iVar40;
                    if ((((bVar23 == 0) && (((uVar33 & 6) != 0) == lVar24 <= lVar32)) &&
                        ((pAVar7->flags & 1) != 0)) && ((uVar20 & 0xffffffff0000) != 0)) {
                      lVar32 = lVar32 - pAVar36[1].org;
                      lVar24 = -lVar32;
                      if (0 < lVar32) {
                        lVar24 = lVar32;
                      }
                      lVar24 = (int)lVar24 * lVar17;
                      iVar12 = (int)((ulong)(lVar24 + (lVar24 >> 0x3f) + 0x8000) >> 0x10);
                      if (iVar12 < iVar40) {
                        pAVar18 = pAVar36 + 1;
                        bVar22 = 0;
                        iVar11 = iVar12;
                      }
                    }
                  }
                }
                pAVar36 = pAVar36 + 3;
                uVar37 = uVar37 - 1;
              } while (uVar37 != 0);
              bVar42 = bVar22 == 0;
            }
            if ((pAVar18 != (AF_Width)0x0) && (pAVar7->blue_edge = pAVar18, !bVar42)) {
              pAVar7->flags = pAVar7->flags | 8;
            }
            pAVar7 = pAVar7 + 1;
          } while (pAVar7 < pAVar34);
        }
      }
    }
    uVar28 = 0;
    do {
      if ((uVar28 & 1) == 0) {
        if ((hints->scaler_flags & 1) == 0) goto LAB_0026c2bd;
        if (uVar28 == 1) goto LAB_0026c2a4;
      }
      else {
LAB_0026c2a4:
        if ((hints->scaler_flags & 2) == 0) {
LAB_0026c2bd:
          pAVar1 = hints->axis + uVar28;
          pAVar7 = hints->axis[uVar28].edges;
          if (pAVar7 == (AF_Edge_conflict)0x0) {
            pAVar34 = (AF_Edge_conflict)0x0;
          }
          else {
            pAVar34 = pAVar7 + pAVar1->num_edges;
          }
          bVar42 = true;
          if (uVar28 == 1) {
            bVar42 = af_script_classes[hints->metrics->style_class->script]->top_to_bottom_hinting
                     == '\0';
            pAVar38 = (AF_Edge_conflict)0x0;
            if (pAVar7 < pAVar34) {
              pAVar38 = (AF_Edge_conflict)0x0;
              pAVar21 = pAVar7;
              do {
                bVar22 = pAVar21->flags;
                if ((bVar22 & 4) == 0) {
                  pAVar41 = pAVar21->link;
                  if ((pAVar41 != (AF_Edge_conflict)0x0 && pAVar21->blue_edge != (AF_Width)0x0) &&
                     (pAVar41->blue_edge != (AF_Width)0x0)) {
                    if ((pAVar41->flags & 8) == 0) {
                      if ((bVar22 & 8) != 0) {
                        pAVar21->blue_edge = (AF_Width)0x0;
                        pAVar21->flags = bVar22 & 0xf3;
                      }
                    }
                    else {
                      pAVar41->blue_edge = (AF_Width)0x0;
                      pAVar41->flags = pAVar41->flags & 0xf7;
                    }
                  }
                  pAVar18 = pAVar21->blue_edge;
                  pAVar13 = pAVar21;
                  pAVar19 = pAVar41;
                  if (pAVar18 == (AF_Width)0x0) {
                    pAVar13 = (AF_Edge_conflict)0x0;
                    pAVar19 = (AF_Edge_conflict)0x0;
                  }
                  if ((pAVar18 == (AF_Width)0x0 && pAVar41 != (AF_Edge_conflict)0x0) &&
                     (pAVar18 = pAVar41->blue_edge, pAVar13 = pAVar41, pAVar19 = pAVar21,
                     pAVar18 == (AF_Width)0x0)) {
                    pAVar18 = (AF_Width)0x0;
                    pAVar13 = (AF_Edge_conflict)0x0;
                    pAVar19 = pAVar41;
                  }
                  if (pAVar13 != (AF_Edge_conflict)0x0) {
                    lVar17 = pAVar18->fit;
                    pAVar13->pos = lVar17;
                    uVar33 = pAVar13->flags | 4;
                    pAVar13->flags = (FT_Byte)uVar33;
                    if ((pAVar19 != (AF_Edge_conflict)0x0) && (pAVar19->blue_edge == (AF_Width)0x0))
                    {
                      bVar22 = pAVar19->flags;
                      FVar8 = af_latin_compute_stem_width
                                        (hints,AF_DIMENSION_VERT,pAVar19->opos - pAVar13->opos,
                                         lVar17 - pAVar13->opos,uVar33,(uint)bVar22);
                      pAVar19->pos = FVar8 + lVar17;
                      pAVar19->flags = bVar22 | 4;
                    }
                    if (pAVar38 == (AF_Edge_conflict)0x0) {
                      pAVar38 = pAVar21;
                    }
                  }
                }
                pAVar21 = pAVar21 + 1;
              } while (pAVar21 < pAVar34);
            }
          }
          else {
            pAVar38 = (AF_Edge_conflict)0x0;
          }
          iVar39 = 0;
          bVar43 = false;
          dim = (AF_Dimension)uVar28;
          pAVar21 = pAVar7;
          if (pAVar7 < pAVar34) {
            do {
              bVar22 = pAVar21->flags;
              if ((bVar22 & 4) == 0) {
                pAVar41 = pAVar21->link;
                if (pAVar41 == (AF_Edge_conflict)0x0) {
                  iVar39 = iVar39 + 1;
                }
                else {
                  uVar33 = (uint)bVar22;
                  if (pAVar41->blue_edge == (AF_Width)0x0) {
                    lVar17 = pAVar21->opos;
                    if (pAVar38 == (AF_Edge_conflict)0x0) {
                      lVar24 = pAVar41->opos - lVar17;
                      FVar8 = af_latin_compute_stem_width
                                        (hints,dim,lVar24,0,uVar33,(uint)pAVar41->flags);
                      if (FVar8 < 0x60) {
                        uVar37 = (lVar24 >> 1) + lVar17 + 0x20U & 0xffffffffffffffc0;
                        if (FVar8 < 0x41) {
                          uVar20 = uVar37 - 0x20;
                          uVar30 = 0x20;
                        }
                        else {
                          uVar20 = uVar37 - 0x26;
                          uVar30 = 0x1a;
                        }
                        lVar26 = (lVar24 >> 1) + lVar17;
                        uVar25 = lVar26 - uVar20;
                        uVar29 = -uVar25;
                        if (0 < (long)uVar25) {
                          uVar29 = uVar25;
                        }
                        uVar35 = lVar26 - (uVar37 | uVar30);
                        uVar25 = -uVar35;
                        if (0 < (long)uVar35) {
                          uVar25 = uVar35;
                        }
                        if (uVar25 <= uVar29) {
                          uVar20 = uVar37 | uVar30;
                        }
                        lVar26 = uVar20 - FVar8 / 2;
                        pAVar21->pos = lVar26;
                        uVar37 = lVar26 + FVar8;
                        pAVar38 = pAVar41;
                      }
                      else {
                        uVar37 = lVar17 + 0x20U & 0xffffffffffffffc0;
                        pAVar38 = pAVar21;
                      }
                      pAVar38->pos = uVar37;
                      pAVar21->flags = bVar22 | 4;
                      lVar26 = pAVar21->pos;
                      FVar8 = af_latin_compute_stem_width
                                        (hints,dim,lVar24,lVar26 - lVar17,(uint)(bVar22 | 4),
                                         (uint)pAVar41->flags);
                      pAVar41->pos = FVar8 + lVar26;
                      pAVar38 = pAVar21;
                    }
                    else {
                      lVar24 = (lVar17 - pAVar38->opos) + pAVar38->pos;
                      lVar17 = pAVar41->opos - lVar17;
                      bVar23 = pAVar41->flags;
                      uVar37 = af_latin_compute_stem_width(hints,dim,lVar17,0,uVar33,(uint)bVar23);
                      if ((bVar23 & 4) == 0) {
                        lVar26 = (lVar17 >> 1) + lVar24;
                        pAVar19 = pAVar41;
                        if ((long)uVar37 < 0x60) {
                          uVar29 = lVar26 + 0x20U & 0xffffffffffffffc0;
                          uVar20 = 0x1a;
                          uVar30 = uVar29 - 0x26;
                          if ((long)uVar37 < 0x41) {
                            uVar20 = 0x20;
                            uVar30 = uVar29 - 0x20;
                          }
                          uVar35 = lVar26 - uVar30;
                          uVar25 = -uVar35;
                          if (0 < (long)uVar35) {
                            uVar25 = uVar35;
                          }
                          uVar14 = lVar26 - (uVar20 | uVar29);
                          uVar35 = -uVar14;
                          if (0 < (long)uVar14) {
                            uVar35 = uVar14;
                          }
                          if (uVar35 <= uVar25) {
                            uVar30 = uVar20 | uVar29;
                          }
                          pAVar21->pos = uVar30 - (long)uVar37 / 2;
                          lVar17 = (long)uVar37 / 2 + uVar30;
                        }
                        else {
                          uVar20 = lVar24 + 0x20U & 0xffffffffffffffc0;
                          uVar29 = (uVar20 + (uVar37 >> 1)) - lVar26;
                          uVar30 = -uVar29;
                          if (0 < (long)uVar29) {
                            uVar30 = uVar29;
                          }
                          uVar25 = (lVar17 + lVar24 + 0x20U & 0xffffffffffffffc0) - uVar37;
                          uVar35 = ((uVar37 >> 1) - lVar26) + uVar25;
                          uVar29 = -uVar35;
                          if (0 < (long)uVar35) {
                            uVar29 = uVar35;
                          }
                          if (uVar29 <= uVar30) {
                            uVar20 = uVar25;
                          }
                          pAVar21->pos = uVar20;
                          lVar17 = uVar37 + uVar20;
                        }
                      }
                      else {
                        lVar17 = pAVar41->pos - uVar37;
                        pAVar19 = pAVar21;
                      }
                      pAVar19->pos = lVar17;
                      pAVar21->flags = bVar22 | 4;
                      pAVar41->flags = pAVar41->flags | 4;
                      if (pAVar7 < pAVar21) {
                        if (bVar42) {
                          if (pAVar21->pos < pAVar21[-1].pos) {
LAB_0026c71a:
                            uVar20 = pAVar41->pos - pAVar21[-1].pos;
                            uVar37 = -uVar20;
                            if (0 < (long)uVar20) {
                              uVar37 = uVar20;
                            }
                            if (0x10 < uVar37) {
                              pAVar21->pos = pAVar21[-1].pos;
                            }
                          }
                        }
                        else if (pAVar21[-1].pos < pAVar21->pos) goto LAB_0026c71a;
                      }
                    }
                  }
                  else {
                    lVar17 = pAVar41->pos;
                    FVar8 = af_latin_compute_stem_width
                                      (hints,dim,pAVar21->opos - pAVar41->opos,
                                       lVar17 - pAVar41->opos,(uint)pAVar41->flags,uVar33);
                    pAVar21->pos = FVar8 + lVar17;
                    pAVar21->flags = bVar22 | 4;
                  }
                }
              }
              pAVar21 = pAVar21 + 1;
            } while (pAVar21 < pAVar34);
            bVar43 = iVar39 != 0;
          }
          if (uVar28 == 0) {
            lVar17 = (long)pAVar34 - (long)pAVar7;
            if (lVar17 == 0x210) {
              lVar24 = 0x160;
              lVar26 = 0xb0;
              pAVar21 = pAVar7;
            }
            else {
              if (lVar17 != 0x420) goto LAB_0026c7fc;
              lVar24 = 0x318;
              lVar26 = 0x1b8;
              pAVar21 = pAVar7 + 1;
            }
            uVar20 = *(long *)((long)&pAVar7->opos + lVar26) * 2 -
                     (pAVar21->opos + *(long *)((long)&pAVar7->opos + lVar24));
            uVar37 = -uVar20;
            if (0 < (long)uVar20) {
              uVar37 = uVar20;
            }
            if (uVar37 < 8) {
              lVar32 = *(long *)((long)&pAVar7->pos + lVar26) * 2 - pAVar21->pos;
              lVar26 = *(long *)((long)&pAVar7->link + lVar24);
              lVar27 = *(long *)((long)&pAVar7->pos + lVar24) - lVar32;
              *(long *)((long)&pAVar7->pos + lVar24) = lVar32;
              if (lVar26 != 0) {
                *(long *)(lVar26 + 0x10) = *(long *)(lVar26 + 0x10) - lVar27;
              }
              if (lVar17 == 0x420) {
                pAVar7[8].pos = pAVar7[8].pos - lVar27;
                pAVar7[0xb].pos = pAVar7[0xb].pos - lVar27;
              }
              (&pAVar7->flags)[lVar24] = (&pAVar7->flags)[lVar24] | 4;
              if (lVar26 != 0) {
                *(byte *)(lVar26 + 0x18) = *(byte *)(lVar26 + 0x18) | 4;
              }
            }
          }
LAB_0026c7fc:
          if (((bool)(bVar43 | pAVar38 == (AF_Edge_conflict)0x0)) && (pAVar7 < pAVar34)) {
            pAVar21 = pAVar7 + -1;
            pAVar19 = pAVar7;
            pAVar41 = pAVar7;
            do {
              pAVar41 = pAVar41 + 1;
              if ((pAVar19->flags & 4) == 0) {
                pAVar2 = pAVar19->serif;
                if (pAVar2 == (AF_Edge)0x0) {
LAB_0026c864:
                  pAVar13 = pAVar21;
                  if (pAVar38 == (AF_Edge_conflict)0x0) {
                    uVar37 = pAVar19->opos + 0x20U & 0xffffffffffffffc0;
                    pAVar38 = pAVar19;
                  }
                  else {
                    do {
                      pAVar15 = pAVar13;
                      pAVar5 = pAVar41;
                      if (pAVar15 < pAVar7) break;
                      pAVar13 = pAVar15 + -1;
                    } while ((pAVar15->flags & 4) == 0);
                    do {
                      pAVar13 = pAVar5;
                      if (pAVar34 <= pAVar13) break;
                      pAVar5 = pAVar13 + 1;
                    } while ((pAVar13->flags & 4) == 0);
                    if ((((pAVar13 < pAVar34) && (pAVar7 <= pAVar15)) && (pAVar15 < pAVar19)) &&
                       (pAVar19 < pAVar13)) {
                      uVar37 = pAVar15->pos;
                      lVar17 = pAVar13->opos - pAVar15->opos;
                      if (lVar17 != 0) {
                        FVar9 = FT_MulDiv(pAVar19->opos - pAVar15->opos,pAVar13->pos - uVar37,lVar17
                                         );
                        uVar37 = uVar37 + FVar9;
                      }
                    }
                    else {
                      uVar37 = ((pAVar19->opos - pAVar38->opos) + 0x10U & 0xffffffffffffffe0) +
                               pAVar38->pos;
                    }
                  }
                }
                else {
                  uVar20 = pAVar2->opos - pAVar19->opos;
                  uVar37 = -uVar20;
                  if (0 < (long)uVar20) {
                    uVar37 = uVar20;
                  }
                  if (0x4f < uVar37) goto LAB_0026c864;
                  uVar37 = (pAVar19->opos - pAVar2->opos) + pAVar2->pos;
                }
                pAVar19->pos = uVar37;
                pAVar19->flags = pAVar19->flags | 4;
                if (pAVar7 < pAVar19) {
                  if (bVar42) {
                    if (pAVar19->pos < pAVar19[-1].pos) {
LAB_0026c938:
                      if (pAVar19->link != (AF_Edge)0x0) {
                        uVar20 = pAVar19->link->pos - pAVar19[-1].pos;
                        uVar37 = -uVar20;
                        if (0 < (long)uVar20) {
                          uVar37 = uVar20;
                        }
                        if (0x10 < uVar37) {
                          pAVar19->pos = pAVar19[-1].pos;
                        }
                      }
                    }
                  }
                  else if (pAVar19[-1].pos < pAVar19->pos) goto LAB_0026c938;
                }
                if ((pAVar19 + 1 < pAVar34) && ((pAVar19[1].flags & 4) != 0)) {
                  if (bVar42) {
                    if (pAVar19[1].pos < pAVar19->pos) {
LAB_0026c9a7:
                      if (pAVar19->link != (AF_Edge)0x0) {
                        uVar20 = pAVar19->link->pos - pAVar19[-1].pos;
                        uVar37 = -uVar20;
                        if (0 < (long)uVar20) {
                          uVar37 = uVar20;
                        }
                        if (0x10 < uVar37) {
                          pAVar19->pos = pAVar19[1].pos;
                        }
                      }
                    }
                  }
                  else if (pAVar19->pos < pAVar19[1].pos) goto LAB_0026c9a7;
                }
              }
              pAVar19 = pAVar19 + 1;
              pAVar21 = pAVar21 + 1;
            } while (pAVar19 < pAVar34);
          }
          pAVar10 = pAVar1->segments;
          if (pAVar10 == (AF_Segment_conflict)0x0) {
            pAVar16 = (AF_Segment_conflict)0x0;
          }
          else {
            pAVar16 = pAVar10 + pAVar1->num_segments;
          }
          if (uVar28 == 0) {
            for (; pAVar10 < pAVar16; pAVar10 = pAVar10 + 1) {
              if (pAVar10->edge != (AF_Edge_conflict)0x0) {
                pAVar3 = (AF_Segment_conflict)pAVar10->last;
                pAVar4 = (AF_Segment)pAVar10->edge->pos;
                pAVar31 = pAVar10;
                do {
                  pAVar31 = (AF_Segment_conflict)pAVar31->first;
                  pAVar31->link = pAVar4;
                  pAVar31->flags = (byte)*(FT_UShort *)&pAVar31->flags | 4;
                } while (pAVar31 != pAVar3);
              }
            }
          }
          else {
            for (; pAVar10 < pAVar16; pAVar10 = pAVar10 + 1) {
              if (pAVar10->edge != (AF_Edge_conflict)0x0) {
                pAVar3 = (AF_Segment_conflict)pAVar10->last;
                pAVar4 = (AF_Segment)pAVar10->edge->pos;
                pAVar31 = pAVar10;
                do {
                  pAVar31 = (AF_Segment_conflict)pAVar31->first;
                  pAVar31->serif = pAVar4;
                  pAVar31->flags = (byte)*(FT_UShort *)&pAVar31->flags | 8;
                } while (pAVar31 != pAVar3);
              }
            }
          }
          af_glyph_hints_align_strong_points(hints,dim);
          af_glyph_hints_align_weak_points(hints,dim);
        }
      }
      bVar42 = uVar28 == 0;
      uVar28 = uVar28 + 1;
    } while (bVar42);
    af_glyph_hints_save(hints,outline);
    FVar6 = 0;
  }
  return FVar6;
}

Assistant:

static FT_Error
  af_latin_hints_apply( FT_UInt          glyph_index,
                        AF_GlyphHints    hints,
                        FT_Outline*      outline,
                        AF_LatinMetrics  metrics )
  {
    FT_Error  error;
    int       dim;

    AF_LatinAxis  axis;


    error = af_glyph_hints_reload( hints, outline );
    if ( error )
      goto Exit;

    /* analyze glyph outline */
    if ( AF_HINTS_DO_HORIZONTAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_HORZ];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_HORZ );
      if ( error )
        goto Exit;
    }

    if ( AF_HINTS_DO_VERTICAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_VERT];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_VERT );
      if ( error )
        goto Exit;

      /* apply blue zones to base characters only */
      if ( !( metrics->root.globals->glyph_styles[glyph_index] & AF_NONBASE ) )
        af_latin_hints_compute_blue_edges( hints, metrics );
    }

    /* grid-fit the outline */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      if ( ( dim == AF_DIMENSION_HORZ && AF_HINTS_DO_HORIZONTAL( hints ) ) ||
           ( dim == AF_DIMENSION_VERT && AF_HINTS_DO_VERTICAL( hints ) )   )
      {
        af_latin_hint_edges( hints, (AF_Dimension)dim );
        af_glyph_hints_align_edge_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_strong_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_weak_points( hints, (AF_Dimension)dim );
      }
    }

    af_glyph_hints_save( hints, outline );

  Exit:
    return error;
  }